

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::RefreshMultiLine(Linenoise *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  char *in_RDI;
  int j;
  AppendBuffer append_buffer;
  value_type *match;
  bool is_dot_command;
  vector<duckdb::highlightToken,_true> tokens;
  idx_t render_end;
  idx_t render_start;
  size_t render_len;
  char *render_buf;
  string highlight_buffer;
  int fd;
  int old_rows;
  int col;
  int new_cursor_x;
  int new_cursor_row;
  int cols;
  int rows;
  int plen;
  char seq [64];
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffac8;
  Linenoise *in_stack_fffffffffffffad0;
  allocator *paVar4;
  int *in_stack_fffffffffffffae8;
  int *in_stack_fffffffffffffaf0;
  Linenoise *in_stack_fffffffffffffaf8;
  int *in_stack_fffffffffffffb00;
  size_t in_stack_fffffffffffffb08;
  Linenoise *in_stack_fffffffffffffb10;
  allocator *paVar5;
  undefined8 in_stack_fffffffffffffb40;
  int iVar6;
  Linenoise *in_stack_fffffffffffffb50;
  reference local_468;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc0;
  idx_t len;
  Linenoise *in_stack_fffffffffffffbd8;
  string local_420;
  allocator local_3f9;
  string local_3f8 [8];
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  Linenoise *in_stack_fffffffffffffc28;
  searchMatch *in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc3f;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffdb8;
  size_t in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0 [8];
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  Linenoise *in_stack_fffffffffffffe30;
  string local_1c8;
  int local_1a8;
  allocator local_1a1;
  string local_1a0 [2];
  string local_160 [32];
  string local_140 [56];
  reference local_108;
  undefined1 local_f9;
  vector<duckdb::highlightToken,_true> local_f8;
  allocator local_d9;
  string local_d8;
  vector<duckdb::highlightToken,_true> *local_a8;
  string *local_a0;
  vector<duckdb::highlightToken,_true> *local_98;
  _Alloc_hider *local_90;
  string local_88 [32];
  undefined4 local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_50;
  int local_4c;
  char local_48 [72];
  
  if ((in_RDI[99] & 1U) != 0) {
    local_4c = GetPromptWidth(in_stack_fffffffffffffad0);
    PositionToColAndRow(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                        in_stack_fffffffffffffb00,&in_stack_fffffffffffffaf8->ifd,
                        in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    if (*(long *)(in_RDI + 0x50) == 0) {
      len = 1;
    }
    else {
      len = *(idx_t *)(in_RDI + 0x50);
    }
    local_64 = (int)len;
    local_68 = *(undefined4 *)(in_RDI + 4);
    ::std::__cxx11::string::string(local_88);
    local_90 = *(_Alloc_hider **)(in_RDI + 8);
    local_a8 = *(vector<duckdb::highlightToken,_true> **)(in_RDI + 0x38);
    local_a0 = (string *)0x0;
    if ((in_RDI[0x60] & 1U) != 0) {
      in_RDI[0x30] = '\0';
      in_RDI[0x31] = '\0';
      in_RDI[0x32] = '\0';
      in_RDI[0x33] = '\0';
      in_RDI[0x34] = '\0';
      in_RDI[0x35] = '\0';
      in_RDI[0x36] = '\0';
      in_RDI[0x37] = '\0';
      local_64 = 0;
      in_RDI[0x60] = '\0';
    }
    local_98 = local_a8;
    if (*(int *)(in_RDI + 0x4c) < local_50) {
      if (local_58 < (int)*(undefined8 *)(in_RDI + 0x40) + 1) {
        *(long *)(in_RDI + 0x40) = (long)(local_58 + -1);
      }
      else if ((int)*(undefined8 *)(in_RDI + 0x40) + *(int *)(in_RDI + 0x4c) < local_58) {
        *(long *)(in_RDI + 0x40) = (long)(local_58 - *(int *)(in_RDI + 0x4c));
      }
      if (*(long *)(in_RDI + 0x40) == 0) {
        local_a0 = (string *)0x0;
      }
      else {
        in_stack_fffffffffffffbc0 =
             (string *)
             ColAndRowToPosition(in_stack_fffffffffffffaf8,
                                 (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                                 (int)in_stack_fffffffffffffaf0);
        local_a0 = in_stack_fffffffffffffbc0;
      }
      if ((int)*(undefined8 *)(in_RDI + 0x40) + *(int *)(in_RDI + 0x4c) < local_50) {
        in_stack_fffffffffffffbb8 =
             (vector<duckdb::highlightToken,_true> *)
             ColAndRowToPosition(in_stack_fffffffffffffaf8,
                                 (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                                 (int)in_stack_fffffffffffffaf0);
        local_a8 = in_stack_fffffffffffffbb8;
      }
      else {
        local_a8 = *(vector<duckdb::highlightToken,_true> **)(in_RDI + 0x38);
      }
      local_58 = local_58 - *(int *)(in_RDI + 0x40);
      local_90 = &local_a0->_M_dataplus + (long)local_90;
      local_98 = (vector<duckdb::highlightToken,_true> *)((long)local_a8 - (long)local_a0);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_d8,"truncate to rows %d - %d (render bytes %d to %d)",&local_d9);
      Log<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                (&local_d8,*(unsigned_long *)(in_RDI + 0x40),
                 *(unsigned_long *)(in_RDI + 0x40) + (long)*(int *)(in_RDI + 0x4c),
                 (unsigned_long)local_a0,(unsigned_long)local_a8);
      ::std::__cxx11::string::~string((string *)&local_d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      local_50 = *(int *)(in_RDI + 0x4c);
    }
    else {
      in_RDI[0x40] = '\0';
      in_RDI[0x41] = '\0';
      in_RDI[0x42] = '\0';
      in_RDI[0x43] = '\0';
      in_RDI[0x44] = '\0';
      in_RDI[0x45] = '\0';
      in_RDI[0x46] = '\0';
      in_RDI[0x47] = '\0';
    }
    if ((int)*(undefined8 *)(in_RDI + 0x50) < local_50) {
      *(long *)(in_RDI + 0x50) = (long)local_50;
    }
    vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x204a62);
    bVar2 = Highlighting::IsEnabled();
    if (bVar2) {
      local_f9 = **(char **)(in_RDI + 8) == '.';
      uVar1 = *(ulong *)(in_RDI + 0xa0);
      sVar3 = ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::size
                        ((vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *)
                         (in_RDI + 0x88));
      if (uVar1 < sVar3) {
        local_468 = ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::
                    operator[]((vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *)
                               (in_RDI + 0x88),*(size_type *)(in_RDI + 0xa0));
      }
      else {
        local_468 = (reference)0x0;
      }
      local_108 = local_468;
      Highlighting::Tokenize
                ((char *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                 (bool)in_stack_fffffffffffffc3f,in_stack_fffffffffffffc30);
      vector<duckdb::highlightToken,_true>::operator=
                ((vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8);
      vector<duckdb::highlightToken,_true>::~vector
                ((vector<duckdb::highlightToken,_true> *)0x204b71);
      AddErrorHighlighting
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18);
      bVar2 = AddCompletionMarker(in_stack_fffffffffffffbd8,in_RDI,len,in_stack_fffffffffffffbc0,
                                  in_stack_fffffffffffffbb8);
      if (bVar2) {
        local_90 = (_Alloc_hider *)::std::__cxx11::string::c_str();
        local_98 = (vector<duckdb::highlightToken,_true> *)::std::__cxx11::string::size();
      }
    }
    if (1 < local_50) {
      in_stack_fffffffffffffac8 = &local_f8;
      AddContinuationMarkers_abi_cxx11_
                (in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,in_stack_fffffffffffffc10,
                 (vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffc40);
      ::std::__cxx11::string::operator=(local_88,local_140);
      ::std::__cxx11::string::~string(local_140);
      local_90 = (_Alloc_hider *)::std::__cxx11::string::c_str();
      local_98 = (vector<duckdb::highlightToken,_true> *)::std::__cxx11::string::size();
    }
    bVar2 = Utf8Proc::IsValid((char *)in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8);
    if ((bVar2) && (bVar2 = Highlighting::IsEnabled(), bVar2)) {
      Highlighting::HighlightText_abi_cxx11_
                ((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      ::std::__cxx11::string::operator=(local_88,local_160);
      ::std::__cxx11::string::~string(local_160);
      local_90 = (_Alloc_hider *)::std::__cxx11::string::c_str();
      local_98 = (vector<duckdb::highlightToken,_true> *)::std::__cxx11::string::size();
    }
    AppendBuffer::AppendBuffer((AppendBuffer *)0x204df1);
    if ((long)local_64 != *(long *)(in_RDI + 0x30)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_1a0,"go down %d",&local_1a1);
      Log<unsigned_long>(local_1a0,(long)local_64 - *(long *)(in_RDI + 0x30));
      ::std::__cxx11::string::~string((string *)local_1a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      snprintf(local_48,0x40,"\x1b[%dB",(ulong)(uint)(local_64 - *(int *)(in_RDI + 0x30)));
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    }
    for (local_1a8 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
        local_1a8 < local_64 + -1; local_1a8 = local_1a8 + 1) {
      in_stack_fffffffffffffb50 = (Linenoise *)&stack0xfffffffffffffe37;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"clear+up",(allocator *)in_stack_fffffffffffffb50);
      Log<>(&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    }
    paVar5 = &local_1f1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f0,"clear",paVar5);
    Log<>((string *)local_1f0);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    AppendBuffer::Append
              ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    if (*(long *)(in_RDI + 0x40) == 0) {
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    }
    AppendBuffer::Append
              ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,0x20512f)
    ;
    RefreshShowHints(in_stack_fffffffffffffb50,(AppendBuffer *)paVar5,iVar6);
    paVar5 = &local_219;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_218,"pos > 0 %d",paVar5);
    Log<int>(&local_218,(uint)(*(long *)(in_RDI + 0x28) != 0));
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdc0,"pos == len %d",
               (allocator *)&stack0xfffffffffffffdbf);
    Log<int>((string *)&stack0xfffffffffffffdc0,
             (uint)(*(long *)(in_RDI + 0x28) == *(long *)(in_RDI + 0x38)));
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_268,"new_cursor_x == cols %d",&local_269);
    Log<int>(&local_268,(uint)(local_5c == *(uint *)(in_RDI + 0x48)));
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_269);
    if (((*(long *)(in_RDI + 0x28) != 0) && (*(long *)(in_RDI + 0x28) == *(long *)(in_RDI + 0x38)))
       && (local_5c == *(uint *)(in_RDI + 0x48))) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_290,"<newline>",&local_291);
      Log<int>(&local_290,0);
      ::std::__cxx11::string::~string((string *)&local_290);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_291);
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
      local_5c = 0;
      if ((int)*(undefined8 *)(in_RDI + 0x50) < local_50) {
        *(long *)(in_RDI + 0x50) = (long)local_50;
      }
    }
    paVar5 = &local_2b9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2b8,"render %d rows (old rows %d)",paVar5);
    Log<int,int>(&local_2b8,local_50,local_64);
    ::std::__cxx11::string::~string((string *)&local_2b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    paVar4 = &local_2e1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2e0,"new_cursor_row %d",paVar4);
    iVar6 = (int)((ulong)paVar4 >> 0x20);
    Log<int>(&local_2e0,local_58);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    paVar4 = &local_309;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_308,"new_cursor_x %d",paVar4);
    Log<int>(&local_308,local_5c);
    ::std::__cxx11::string::~string((string *)&local_308);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
    paVar4 = &local_331;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_330,"len %d",paVar4);
    Log<unsigned_long>(&local_330,*(unsigned_long *)(in_RDI + 0x38));
    ::std::__cxx11::string::~string((string *)&local_330);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_331);
    paVar4 = &local_359;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_358,"old_cursor_rows %d",paVar4);
    Log<unsigned_long>(&local_358,*(unsigned_long *)(in_RDI + 0x30));
    ::std::__cxx11::string::~string((string *)&local_358);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_359);
    paVar4 = &local_381;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_380,"pos %d",paVar4);
    Log<unsigned_long>(&local_380,*(unsigned_long *)(in_RDI + 0x28));
    ::std::__cxx11::string::~string((string *)&local_380);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
    paVar4 = &local_3a9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a8,"max cols %d",paVar4);
    Log<int>(&local_3a8,*(int *)(in_RDI + 0x48));
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    if (0 < local_50 - local_58) {
      paVar4 = (allocator *)&stack0xfffffffffffffc2f;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&stack0xfffffffffffffc30,"go-up %d",paVar4);
      Log<int>((string *)&stack0xfffffffffffffc30,local_50 - local_58);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffc30);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc2f);
      snprintf(local_48,0x40,"\x1b[%dA",(ulong)(uint)(local_50 - local_58));
      AppendBuffer::Append
                ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    }
    local_60 = local_5c;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_3f8,"set col %d",&local_3f9);
    Log<int>((string *)local_3f8,local_60 + 1);
    ::std::__cxx11::string::~string(local_3f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    if (local_60 == 0) {
      snprintf(local_48,0x40,"\r");
    }
    else {
      snprintf(local_48,0x40,"\r\x1b[%dC",(ulong)local_60);
    }
    AppendBuffer::Append
              ((AppendBuffer *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    paVar4 = (allocator *)&stack0xfffffffffffffbdf;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_420,anon_var_dwarf_3e83f70 + 8,paVar4);
    Log<>(&local_420);
    ::std::__cxx11::string::~string((string *)&local_420);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbdf);
    *(long *)(in_RDI + 0x30) = (long)local_58;
    AppendBuffer::Write((AppendBuffer *)paVar5,iVar6);
    AppendBuffer::~AppendBuffer((AppendBuffer *)0x205c3b);
    vector<duckdb::highlightToken,_true>::~vector((vector<duckdb::highlightToken,_true> *)0x205c48);
    ::std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void Linenoise::RefreshMultiLine() {
	if (!render) {
		return;
	}
	char seq[64];
	int plen = GetPromptWidth();
	// utf8 in prompt, get render width
	int rows, cols;
	int new_cursor_row, new_cursor_x;
	PositionToColAndRow(pos, new_cursor_row, new_cursor_x, rows, cols);
	int col; /* column position, zero-based. */
	int old_rows = maxrows ? maxrows : 1;
	int fd = ofd;
	std::string highlight_buffer;
	auto render_buf = this->buf;
	auto render_len = this->len;
	idx_t render_start = 0;
	idx_t render_end = render_len;
	if (clear_screen) {
		old_cursor_rows = 0;
		old_rows = 0;
		clear_screen = false;
	}
	if (rows > ws.ws_row) {
		// the text does not fit in the terminal (too many rows)
		// enable scrolling mode
		// check if, given the current y_scroll, the cursor is visible
		// display range is [y_scroll, y_scroll + ws.ws_row]
		if (new_cursor_row < int(y_scroll) + 1) {
			y_scroll = new_cursor_row - 1;
		} else if (new_cursor_row > int(y_scroll) + int(ws.ws_row)) {
			y_scroll = new_cursor_row - ws.ws_row;
		}
		// display only characters up to the current scroll position
		if (y_scroll == 0) {
			render_start = 0;
		} else {
			render_start = ColAndRowToPosition(y_scroll, 0);
		}
		if (int(y_scroll) + int(ws.ws_row) >= rows) {
			render_end = len;
		} else {
			render_end = ColAndRowToPosition(y_scroll + ws.ws_row, 99999);
		}
		new_cursor_row -= y_scroll;
		render_buf += render_start;
		render_len = render_end - render_start;
		Linenoise::Log("truncate to rows %d - %d (render bytes %d to %d)", y_scroll, y_scroll + ws.ws_row, render_start,
		               render_end);
		rows = ws.ws_row;
	} else {
		y_scroll = 0;
	}

	/* Update maxrows if needed. */
	if (rows > (int)maxrows) {
		maxrows = rows;
	}

	vector<highlightToken> tokens;
	if (Highlighting::IsEnabled()) {
		bool is_dot_command = buf[0] == '.';
		auto match = search_index < search_matches.size() ? &search_matches[search_index] : nullptr;
		tokens = Highlighting::Tokenize(render_buf, render_len, is_dot_command, match);

		// add error highlighting
		AddErrorHighlighting(render_start, render_end, tokens);

		// add completion hint
		if (AddCompletionMarker(render_buf, render_len, highlight_buffer, tokens)) {
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}
	if (rows > 1) {
		// add continuation markers
		highlight_buffer = AddContinuationMarkers(render_buf, render_len, plen,
		                                          y_scroll > 0 ? new_cursor_row + 1 : new_cursor_row, tokens);
		render_buf = (char *)highlight_buffer.c_str();
		render_len = highlight_buffer.size();
	}
	if (duckdb::Utf8Proc::IsValid(render_buf, render_len)) {
		if (Highlighting::IsEnabled()) {
			highlight_buffer = Highlighting::HighlightText(render_buf, render_len, 0, render_len, tokens);
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}

	/* First step: clear all the lines used before. To do so start by
	 * going to the last row. */
	AppendBuffer append_buffer;
	if (old_rows - old_cursor_rows > 0) {
		Linenoise::Log("go down %d", old_rows - old_cursor_rows);
		snprintf(seq, 64, "\x1b[%dB", old_rows - int(old_cursor_rows));
		append_buffer.Append(seq);
	}

	/* Now for every row clear it, go up. */
	for (int j = 0; j < old_rows - 1; j++) {
		Linenoise::Log("clear+up");
		append_buffer.Append("\r\x1b[0K\x1b[1A");
	}

	/* Clean the top line. */
	Linenoise::Log("clear");
	append_buffer.Append("\r\x1b[0K");

	/* Write the prompt and the current buffer content */
	if (y_scroll == 0) {
		append_buffer.Append(prompt);
	}
	append_buffer.Append(render_buf, render_len);

	/* Show hints if any. */
	RefreshShowHints(append_buffer, plen);

	/* If we are at the very end of the screen with our prompt, we need to
	 * emit a newline and move the prompt to the first column. */
	Linenoise::Log("pos > 0 %d", pos > 0 ? 1 : 0);
	Linenoise::Log("pos == len %d", pos == len ? 1 : 0);
	Linenoise::Log("new_cursor_x == cols %d", new_cursor_x == ws.ws_col ? 1 : 0);
	if (pos > 0 && pos == len && new_cursor_x == ws.ws_col) {
		Linenoise::Log("<newline>", 0);
		append_buffer.Append("\n");
		append_buffer.Append("\r");
		rows++;
		new_cursor_row++;
		new_cursor_x = 0;
		if (rows > (int)maxrows) {
			maxrows = rows;
		}
	}
	Linenoise::Log("render %d rows (old rows %d)", rows, old_rows);

	/* Move cursor to right position. */
	Linenoise::Log("new_cursor_row %d", new_cursor_row);
	Linenoise::Log("new_cursor_x %d", new_cursor_x);
	Linenoise::Log("len %d", len);
	Linenoise::Log("old_cursor_rows %d", old_cursor_rows);
	Linenoise::Log("pos %d", pos);
	Linenoise::Log("max cols %d", ws.ws_col);

	/* Go up till we reach the expected position. */
	if (rows - new_cursor_row > 0) {
		Linenoise::Log("go-up %d", rows - new_cursor_row);
		snprintf(seq, 64, "\x1b[%dA", rows - new_cursor_row);
		append_buffer.Append(seq);
	}

	/* Set column. */
	col = new_cursor_x;
	Linenoise::Log("set col %d", 1 + col);
	if (col) {
		snprintf(seq, 64, "\r\x1b[%dC", col);
	} else {
		snprintf(seq, 64, "\r");
	}
	append_buffer.Append(seq);

	Linenoise::Log("\n");
	old_cursor_rows = new_cursor_row;
	append_buffer.Write(fd);
}